

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

string * __thiscall
Catch::Matchers::StdString::CasedString::caseSensitivitySuffix_abi_cxx11_
          (string *__return_storage_ptr__,CasedString *this)

{
  allocator local_9;
  
  if (this->m_caseSensitivity == No) {
    std::__cxx11::string::string((string *)__return_storage_ptr__," (case insensitive)",&local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CasedString::caseSensitivitySuffix() const {
            return m_caseSensitivity == CaseSensitive::No
                   ? " (case insensitive)"
                   : std::string();
        }